

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::ParseElemExprListOpt(WastParser *this,ExprListVector *out_list)

{
  pointer piVar1;
  pointer piVar2;
  Expr *pEVar3;
  _func_int ***ppp_Var4;
  bool bVar5;
  ExprList local_38;
  
  local_38.first_ = (Expr *)0x0;
  local_38.last_ = (Expr *)0x0;
  local_38.size_ = 0;
  bVar5 = ParseElemExprOpt(this,&local_38);
  if (bVar5) {
    do {
      std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
      ::emplace_back<wabt::intrusive_list<wabt::Expr>>
                ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                  *)out_list,&local_38);
      bVar5 = ParseElemExprOpt(this,&local_38);
    } while (bVar5);
  }
  piVar1 = (out_list->
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (out_list->
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = local_38.first_;
  while (pEVar3 != (Expr *)0x0) {
    ppp_Var4 = &pEVar3->_vptr_Expr;
    pEVar3 = (pEVar3->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var4)[1])();
  }
  return piVar1 != piVar2;
}

Assistant:

bool WastParser::ParseElemExprListOpt(ExprListVector* out_list) {
  ExprList elem_expr;
  while (ParseElemExprOpt(&elem_expr)) {
    out_list->push_back(std::move(elem_expr));
  }
  return !out_list->empty();
}